

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QSize __thiscall QFormLayout::sizeHint(QFormLayout *this)

{
  long lVar1;
  bool bVar2;
  QFormLayoutPrivate *this_00;
  long in_FS_OFFSET;
  QFormLayoutPrivate *in_stack_00000008;
  QFormLayoutPrivate *dat;
  QFormLayoutPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFormLayout *)0x4b7ac5);
  bVar2 = QSize::isValid((QSize *)this_00);
  if (!bVar2) {
    QFormLayoutPrivate::calcSizeHints(in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00->prefSize;
  }
  __stack_chk_fail();
}

Assistant:

QSize QFormLayout::sizeHint() const
{
    Q_D(const QFormLayout);
    if (!d->prefSize.isValid()) {
        QFormLayoutPrivate *dat = const_cast<QFormLayoutPrivate *>(d);
        dat->calcSizeHints();
    }
    return d->prefSize;
}